

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID id;
  uint32_t uVar1;
  VariableID combined_module_id;
  SPIRFunction *caller;
  Compiler *pCVar2;
  size_t sVar3;
  CombinedImageSampler *pCVar4;
  bool bVar5;
  undefined2 uVar6;
  Dim DVar7;
  bool bVar8;
  undefined1 uVar9;
  ImageFormat IVar10;
  AccessQualifier AVar11;
  TypeID TVar12;
  TypeID TVar13;
  bool bVar14;
  ID id_00;
  ID id_01;
  uint32_t uVar15;
  ulong uVar16;
  SPIRVariable *pSVar17;
  SPIRType *pSVar18;
  CompilerError *this_00;
  _Elt_pointer ppSVar19;
  SPIRType *pSVar20;
  uint32_t *puVar21;
  CombinedImageSampler *pCVar22;
  CombinedImageSampler *pCVar23;
  long lVar24;
  VariableID sampler_id;
  uint32_t result_type;
  TypeID local_54;
  VariableID local_50;
  bool local_4c [4];
  SmallVector<unsigned_int,_8UL> *local_48;
  SmallVector<bool,_8UL> *local_40;
  int local_34;
  
  uVar16 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_0032f289:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    local_54.id = *args;
    pSVar18 = Variant::get<diligent_spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                         ptr + local_54.id);
    if ((pSVar18->basetype != Sampler) &&
       ((pSVar18->image).sampled != 1 || pSVar18->basetype != Image)) {
      return true;
    }
LAB_0032f151:
    uVar15 = args[1];
    uVar1 = args[2];
    local_4c[0] = true;
    set<diligent_spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (this->compiler,uVar15,(char (*) [1])0x6e6688,&local_54.id,local_4c);
    register_read(this->compiler,uVar15,uVar1,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar16 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar16 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      local_54.id = *args;
      pSVar18 = Variant::get<diligent_spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                           ptr + local_54.id);
      if (pSVar18->basetype == Sampler) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                  );
        goto LAB_0032f7a3;
      }
      if (pSVar18->basetype != Image) {
        return true;
      }
      if ((pSVar18->image).sampled != 1) {
        return true;
      }
      goto LAB_0032f151;
    }
    if (uVar16 != 0x15) goto LAB_0032f289;
    bVar14 = false;
  }
  else {
    pSVar17 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar17 == (SPIRVariable *)0x0) {
      bVar14 = false;
    }
    else {
      pSVar18 = Variant::get<diligent_spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                           ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
      bVar14 = false;
      if ((((pSVar18->basetype == Image) && ((pSVar18->image).sampled == 1)) &&
          (bVar14 = false, (pSVar18->image).dim != Buffer)) &&
         (bVar14 = true, this->compiler->dummy_sampler_id == 0)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                  );
LAB_0032f7a3:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (!bVar14) {
      return true;
    }
  }
  ppSVar19 = (this->functions).c.
             super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar19 !=
      (this->functions).c.
      super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar19 ==
        (this->functions).c.
        super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar19 = (this->functions).c.
                 super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar19[-1];
    if (caller->do_combined_parameters == true) {
      uVar15 = args[2];
      pSVar17 = maybe_get_backing_variable(this->compiler,uVar15);
      if (pSVar17 != (SPIRVariable *)0x0) {
        uVar15 = (pSVar17->super_IVariant).self.id;
      }
      puVar21 = args + 3;
      if (bVar14) {
        puVar21 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar21;
      local_50.id = uVar15;
      pSVar17 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar17 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar17->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar18 = Variant::get<diligent_spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                           ptr + *args);
      register_combined_image_sampler
                (this,caller,combined_module_id,local_50,sampler_id,(pSVar18->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar14) {
    id_01.id = this->compiler->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
  }
  pCVar2 = this->compiler;
  pCVar23 = (pCVar2->combined_image_samplers).
            super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
  sVar3 = (pCVar2->combined_image_samplers).
          super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
  pCVar4 = pCVar23 + sVar3;
  lVar24 = (long)sVar3 >> 2;
  pCVar22 = pCVar23;
  if (0 < lVar24) {
    pCVar22 = pCVar23 + lVar24 * 4;
    lVar24 = lVar24 + 1;
    pCVar23 = pCVar23 + 2;
    do {
      if ((pCVar23[-2].image_id.id == id_00.id) && (pCVar23[-2].sampler_id.id == id_01.id)) {
        pCVar23 = pCVar23 + -2;
        goto LAB_0032f3fe;
      }
      if ((pCVar23[-1].image_id.id == id_00.id) && (pCVar23[-1].sampler_id.id == id_01.id)) {
        pCVar23 = pCVar23 + -1;
        goto LAB_0032f3fe;
      }
      if (((pCVar23->image_id).id == id_00.id) && ((pCVar23->sampler_id).id == id_01.id))
      goto LAB_0032f3fe;
      if ((pCVar23[1].image_id.id == id_00.id) && (pCVar23[1].sampler_id.id == id_01.id)) {
        pCVar23 = pCVar23 + 1;
        goto LAB_0032f3fe;
      }
      lVar24 = lVar24 + -1;
      pCVar23 = pCVar23 + 4;
    } while (1 < lVar24);
  }
  lVar24 = ((long)pCVar4 - (long)pCVar22 >> 2) * -0x5555555555555555;
  if (lVar24 != 1) {
    if (lVar24 != 2) {
      pCVar23 = pCVar4;
      if ((lVar24 != 3) ||
         (((pCVar22->image_id).id == id_00.id &&
          (pCVar23 = pCVar22, (pCVar22->sampler_id).id == id_01.id)))) goto LAB_0032f3fe;
      pCVar22 = pCVar22 + 1;
    }
    if (((pCVar22->image_id).id == id_00.id) &&
       (pCVar23 = pCVar22, (pCVar22->sampler_id).id == id_01.id)) goto LAB_0032f3fe;
    pCVar22 = pCVar22 + 1;
  }
  pCVar23 = pCVar4;
  if (((pCVar22->image_id).id == id_00.id) &&
     (pCVar23 = pCVar22, (pCVar22->sampler_id).id != id_01.id)) {
    pCVar23 = pCVar4;
  }
LAB_0032f3fe:
  if (pCVar23 == pCVar4) {
    if (bVar14) {
      uVar15 = ParsedIR::increase_bound_by(&pCVar2->ir,1);
      local_54.id = 0x1b;
      local_48 = (SmallVector<unsigned_int,_8UL> *)CONCAT44(local_48._4_4_,uVar15);
      pSVar18 = set<diligent_spirv_cross::SPIRType,spv::Op>(this->compiler,uVar15,&local_54.id);
      pCVar2 = this->compiler;
      uVar15 = expression_type_id(pCVar2,args[2]);
      pSVar20 = Variant::get<diligent_spirv_cross::SPIRType>
                          ((pCVar2->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                           uVar15);
      (pSVar18->super_IVariant).self.id = (pSVar20->super_IVariant).self.id;
      pSVar18->columns = pSVar20->columns;
      uVar15 = pSVar20->width;
      uVar1 = pSVar20->vecsize;
      *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
           *(undefined8 *)&(pSVar20->super_IVariant).field_0xc;
      pSVar18->width = uVar15;
      pSVar18->vecsize = uVar1;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar18->array,&pSVar20->array);
      SmallVector<bool,_8UL>::operator=(&pSVar18->array_size_literal,&pSVar20->array_size_literal);
      bVar14 = pSVar20->pointer;
      bVar5 = pSVar20->forward_pointer;
      uVar6 = *(undefined2 *)&pSVar20->field_0x7e;
      pSVar18->pointer_depth = pSVar20->pointer_depth;
      pSVar18->pointer = bVar14;
      pSVar18->forward_pointer = bVar5;
      *(undefined2 *)&pSVar18->field_0x7e = uVar6;
      pSVar18->storage = pSVar20->storage;
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar18->member_types,&pSVar20->member_types);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar18->member_type_index_redirection,&pSVar20->member_type_index_redirection);
      DVar7 = (pSVar20->image).dim;
      bVar14 = (pSVar20->image).depth;
      bVar5 = (pSVar20->image).arrayed;
      bVar8 = (pSVar20->image).ms;
      uVar9 = (pSVar20->image).field_0xb;
      uVar15 = (pSVar20->image).sampled;
      IVar10 = (pSVar20->image).format;
      AVar11 = (pSVar20->image).access;
      TVar12.id = (pSVar20->type_alias).id;
      TVar13.id = (pSVar20->parent_type).id;
      (pSVar18->image).type = (TypeID)(pSVar20->image).type.id;
      (pSVar18->image).dim = DVar7;
      (pSVar18->image).depth = bVar14;
      (pSVar18->image).arrayed = bVar5;
      (pSVar18->image).ms = bVar8;
      (pSVar18->image).field_0xb = uVar9;
      (pSVar18->image).sampled = uVar15;
      (pSVar18->image).format = IVar10;
      (pSVar18->image).access = AVar11;
      pSVar18->type_alias = (TypeID)TVar12.id;
      pSVar18->parent_type = (TypeID)TVar13.id;
      if (pSVar20 != pSVar18) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar18->member_name_cache,&(pSVar20->member_name_cache)._M_h);
      }
      (pSVar18->super_IVariant).self.id = (uint32_t)local_48;
      pSVar18->basetype = SampledImage;
      (pSVar18->image).depth = false;
      local_50.id = 0;
      uVar15 = (uint32_t)local_48;
    }
    else {
      uVar15 = *args;
      local_50.id = args[1];
    }
    local_54.id = ParsedIR::increase_bound_by(&this->compiler->ir,2);
    id.id = local_54.id + 1;
    local_4c[0] = true;
    local_4c[1] = false;
    local_4c[2] = false;
    local_4c[3] = false;
    pSVar18 = set<diligent_spirv_cross::SPIRType,spv::Op>(this->compiler,local_54.id,(Op *)local_4c)
    ;
    pSVar20 = Variant::get<diligent_spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                         ptr + uVar15);
    (pSVar18->super_IVariant).self.id = (pSVar20->super_IVariant).self.id;
    pSVar18->columns = pSVar20->columns;
    uVar15 = pSVar20->width;
    uVar1 = pSVar20->vecsize;
    *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar20->super_IVariant).field_0xc;
    pSVar18->width = uVar15;
    pSVar18->vecsize = uVar1;
    local_48 = &pSVar18->array;
    SmallVector<unsigned_int,_8UL>::operator=(local_48,&pSVar20->array);
    local_40 = &pSVar18->array_size_literal;
    SmallVector<bool,_8UL>::operator=(local_40,&pSVar20->array_size_literal);
    bVar14 = pSVar20->pointer;
    bVar5 = pSVar20->forward_pointer;
    uVar6 = *(undefined2 *)&pSVar20->field_0x7e;
    pSVar18->pointer_depth = pSVar20->pointer_depth;
    pSVar18->pointer = bVar14;
    pSVar18->forward_pointer = bVar5;
    *(undefined2 *)&pSVar18->field_0x7e = uVar6;
    pSVar18->storage = pSVar20->storage;
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar18->member_types,&pSVar20->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar18->member_type_index_redirection,&pSVar20->member_type_index_redirection);
    DVar7 = (pSVar20->image).dim;
    bVar14 = (pSVar20->image).depth;
    bVar5 = (pSVar20->image).arrayed;
    bVar8 = (pSVar20->image).ms;
    uVar9 = (pSVar20->image).field_0xb;
    uVar15 = (pSVar20->image).sampled;
    IVar10 = (pSVar20->image).format;
    AVar11 = (pSVar20->image).access;
    TVar12.id = (pSVar20->type_alias).id;
    TVar13.id = (pSVar20->parent_type).id;
    (pSVar18->image).type = (TypeID)(pSVar20->image).type.id;
    (pSVar18->image).dim = DVar7;
    (pSVar18->image).depth = bVar14;
    (pSVar18->image).arrayed = bVar5;
    (pSVar18->image).ms = bVar8;
    (pSVar18->image).field_0xb = uVar9;
    (pSVar18->image).sampled = uVar15;
    (pSVar18->image).format = IVar10;
    (pSVar18->image).access = AVar11;
    pSVar18->type_alias = (TypeID)TVar12.id;
    pSVar18->parent_type = (TypeID)TVar13.id;
    if (pSVar20 != pSVar18) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar18->member_name_cache,&(pSVar20->member_name_cache)._M_h);
    }
    pSVar18->pointer = true;
    pSVar18->storage = StorageClassUniformConstant;
    (pSVar18->parent_type).id = local_54.id;
    local_4c[0] = false;
    local_4c[1] = false;
    local_4c[2] = false;
    local_4c[3] = false;
    local_34 = 0;
    set<diligent_spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this->compiler,id.id,&local_54.id,(StorageClass *)local_4c,&local_34);
    if ((((id_01.id != 0) &&
         (bVar14 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
         bVar14)) ||
        ((id_00.id != 0 &&
         (bVar14 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
         bVar14)))) ||
       ((local_50.id != 0 &&
        (bVar14 = ParsedIR::has_decoration
                            (&this->compiler->ir,(ID)local_50.id,DecorationRelaxedPrecision), bVar14
        )))) {
      ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
    }
    pSVar17 = maybe_get_backing_variable(this->compiler,id_00.id);
    if (pSVar17 != (SPIRVariable *)0x0) {
      pSVar18 = Variant::get<diligent_spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                           ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
      SmallVector<unsigned_int,_8UL>::operator=(local_48,&pSVar18->array);
      SmallVector<bool,_8UL>::operator=(local_40,&pSVar18->array_size_literal);
    }
    pCVar2 = this->compiler;
    SmallVector<diligent_spirv_cross::CombinedImageSampler,_8UL>::reserve
              (&pCVar2->combined_image_samplers,
               (pCVar2->combined_image_samplers).
               super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size + 1);
    pCVar4 = (pCVar2->combined_image_samplers).
             super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
    sVar3 = (pCVar2->combined_image_samplers).
            super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
    pCVar4[sVar3].combined_id.id = id.id;
    pCVar4[sVar3].image_id.id = id_00.id;
    pCVar4[sVar3].sampler_id.id = id_01.id;
    (pCVar2->combined_image_samplers).super_VectorView<diligent_spirv_cross::CombinedImageSampler>.
    buffer_size = sVar3 + 1;
  }
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type, OpTypeSampledImage);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id, OpTypePointer);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}